

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttdriver.c
# Opt level: O2

FT_Error tt_size_request(FT_Size size,FT_Size_Request req)

{
  int iVar1;
  int iVar2;
  FT_Error FVar3;
  FT_Long FVar4;
  ulong c_;
  FT_Face face;
  FT_ULong strike_index;
  
  face = size->face;
  iVar1 = 0;
  if ((face->face_flags & 2) != 0) {
    iVar1 = (**(code **)(*(long *)&face[3].units_per_EM + 0xd0))(face,req,&strike_index);
    if (iVar1 == 0) {
      FVar3 = tt_size_select(size,strike_index);
      return FVar3;
    }
    size[2].metrics.height = 0xffffffff;
    face = size->face;
  }
  iVar2 = FT_Request_Metrics(face,req);
  if ((iVar2 == 0) && (iVar2 = iVar1, (size->face->face_flags & 1) != 0)) {
    iVar2 = tt_size_reset((TT_Size)size,'\0');
    if (iVar2 == 0) {
      c_ = (ulong)(&req->horiResolution)
                  [(ushort)(size[1].face)->num_faces <=
                   *(ushort *)((long)&(size[1].face)->num_faces + 2)];
      if ((ulong)(&req->horiResolution)
                 [(ushort)(size[1].face)->num_faces <=
                  *(ushort *)((long)&(size[1].face)->num_faces + 2)] == 0) {
        c_ = 0x48;
      }
      if (req->type == FT_SIZE_REQUEST_TYPE_SCALES) {
        c_ = 0x48;
      }
      FVar4 = FT_MulDiv((ulong)*(ushort *)&size[1].internal,0x1200,c_);
      size[2].metrics.max_advance = FVar4;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static FT_Error
  tt_size_request( FT_Size          size,
                   FT_Size_Request  req )
  {
    TT_Size   ttsize = (TT_Size)size;
    FT_Error  error  = FT_Err_Ok;


#ifdef TT_CONFIG_OPTION_EMBEDDED_BITMAPS

    if ( FT_HAS_FIXED_SIZES( size->face ) )
    {
      TT_Face       ttface = (TT_Face)size->face;
      SFNT_Service  sfnt   = (SFNT_Service)ttface->sfnt;
      FT_ULong      strike_index;


      error = sfnt->set_sbit_strike( ttface, req, &strike_index );

      if ( error )
        ttsize->strike_index = 0xFFFFFFFFUL;
      else
        return tt_size_select( size, strike_index );
    }

#endif /* TT_CONFIG_OPTION_EMBEDDED_BITMAPS */

    {
      FT_Error  err = FT_Request_Metrics( size->face, req );


      if ( err )
      {
        error = err;
        goto Exit;
      }
    }

    if ( FT_IS_SCALABLE( size->face ) )
    {
      error = tt_size_reset( ttsize, 0 );

#ifdef TT_USE_BYTECODE_INTERPRETER
      /* for the `MPS' bytecode instruction we need the point size */
      if ( !error )
      {
        FT_UInt  resolution =
                   ttsize->metrics->x_ppem > ttsize->metrics->y_ppem
                     ? req->horiResolution
                     : req->vertResolution;


        /* if we don't have a resolution value, assume 72dpi */
        if ( req->type == FT_SIZE_REQUEST_TYPE_SCALES ||
             !resolution                              )
          resolution = 72;

        ttsize->point_size = FT_MulDiv( ttsize->ttmetrics.ppem,
                                        64 * 72,
                                        resolution );
      }
#endif
    }

  Exit:
    return error;
  }